

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void __thiscall ghc::filesystem::path::iterator::updateCurrent(iterator *this)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last;
  bool bVar1;
  reference pcVar2;
  const_iterator first;
  path *in_RDI;
  const_iterator *in_stack_00000020;
  iterator *in_stack_00000028;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffb8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffc0;
  uint7 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 uVar3;
  
  bVar1 = __gnu_cxx::operator==(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  uVar3 = true;
  if (!bVar1) {
    bVar1 = __gnu_cxx::operator!=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    uVar3 = false;
    if (bVar1) {
      bVar1 = __gnu_cxx::operator!=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      uVar3 = false;
      if (bVar1) {
        pcVar2 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)(in_RDI + 1));
        uVar3 = false;
        if (*pcVar2 == '/') {
          bVar1 = __gnu_cxx::operator!=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
          uVar3 = false;
          if (bVar1) {
            __gnu_cxx::
            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)(ulong)in_stack_ffffffffffffffc8,
                        (difference_type)in_stack_ffffffffffffffc0);
            uVar3 = __gnu_cxx::operator==(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
          }
        }
      }
    }
  }
  if ((bool)uVar3 == false) {
    first = increment(in_stack_00000028,in_stack_00000020);
    last._M_current._7_1_ = uVar3;
    last._M_current._0_7_ = in_stack_ffffffffffffffd8;
    assign<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              (in_RDI,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )first._M_current,last);
  }
  else {
    clear((path *)0x1335da);
  }
  return;
}

Assistant:

GHC_INLINE void path::iterator::updateCurrent()
{
    if ((_iter == _last) || (_iter != _first && _iter != _last && (*_iter == preferred_separator && _iter != _root) && (_iter + 1 == _last))) {
        _current.clear();
    }
    else {
        _current.assign(_iter, increment(_iter));
    }
}